

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_insert.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::ResolveDefaultsProjection
          (PhysicalPlanGenerator *this,LogicalInsert *op,PhysicalOperator *child)

{
  pointer *pprVar1;
  size_type __n;
  storage_t index;
  iterator __position;
  pointer pLVar2;
  ColumnList *this_00;
  ColumnDefinition *this_01;
  storage_t *psVar3;
  PhysicalIndex __n_00;
  reference pvVar4;
  LogicalType *pLVar5;
  BoundReferenceExpression *this_02;
  reference __args;
  pointer this_03;
  PhysicalOperator *pPVar6;
  InternalException *this_04;
  _func_int **pp_Var7;
  ColumnListIterator CVar8;
  ColumnLogicalIteratorInternal __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  select_list;
  vector<duckdb::LogicalType,_true> types;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_a8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88 [2];
  undefined8 local_58;
  undefined8 local_50;
  LogicalType local_48;
  
  local_88[1].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)this;
  local_88[1].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)child;
  if ((op->column_index_map).internal_vector.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (op->column_index_map).internal_vector.
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_88[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88[0].super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = TableCatalogEntry::GetColumns(op->table);
    CVar8 = ColumnList::Physical(this_00);
    local_d8._0_8_ = CVar8.list;
    local_d8[8] = CVar8.physical;
    if (((undefined1  [16])CVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_c8._8_8_ =
           ((long)*(pointer *)&((PhysicalOperator *)local_d8._0_8_)->type -
            (long)(((vector<duckdb::ColumnDefinition,_true> *)
                   &((PhysicalOperator *)local_d8._0_8_)->_vptr_PhysicalOperator)->
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
                  .
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      local_c8._8_8_ =
           (long)(((PhysicalOperator *)local_d8._0_8_)->lock).super___mutex_base._M_mutex.__align -
           (long)(((vector<unsigned_long,_true> *)&((PhysicalOperator *)local_d8._0_8_)->op_state)->
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
    }
    local_c8._0_8_ = (_func_int **)0x0;
    if (((undefined1  [16])CVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var7 = (_func_int **)
                (((long)*(pointer *)&((PhysicalOperator *)local_d8._0_8_)->type -
                  (long)(((vector<duckdb::ColumnDefinition,_true> *)
                         &((PhysicalOperator *)local_d8._0_8_)->_vptr_PhysicalOperator)->
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ).
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
    }
    else {
      pp_Var7 = (_func_int **)
                ((long)(((PhysicalOperator *)local_d8._0_8_)->lock).super___mutex_base._M_mutex.
                       __align -
                 (long)(((vector<unsigned_long,_true> *)
                        &((PhysicalOperator *)local_d8._0_8_)->op_state)->
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
    }
    if (((undefined1  [16])CVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_c8._16_8_ =
           ((long)*(pointer *)&((PhysicalOperator *)local_d8._0_8_)->type -
            (long)(((vector<duckdb::ColumnDefinition,_true> *)
                   &((PhysicalOperator *)local_d8._0_8_)->_vptr_PhysicalOperator)->
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
                  .
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      local_c8._16_8_ =
           (long)(((PhysicalOperator *)local_d8._0_8_)->lock).super___mutex_base._M_mutex.__align -
           (long)(((vector<unsigned_long,_true> *)&((PhysicalOperator *)local_d8._0_8_)->op_state)->
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
    }
    local_c8._24_8_ = local_d8._0_8_;
    if ((pp_Var7 != (_func_int **)0x0) || (local_c8._8_8_ != local_c8._16_8_)) {
      local_50 = &op->column_index_map;
      local_58 = &op->bound_defaults;
      do {
        this_01 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                            ((ColumnLogicalIteratorInternal *)local_d8);
        psVar3 = ColumnDefinition::StorageOid(this_01);
        __n = *psVar3;
        __n_00 = ColumnDefinition::Physical(this_01);
        pvVar4 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)local_50,__n_00.index);
        index = *pvVar4;
        if (index == 0xffffffffffffffff) {
          __args = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                 *)local_58,__n);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_a8,__args);
        }
        else {
          pLVar5 = ColumnDefinition::Type(this_01);
          this_02 = (BoundReferenceExpression *)operator_new(0x60);
          LogicalType::LogicalType(&local_48,pLVar5);
          BoundReferenceExpression::BoundReferenceExpression(this_02,&local_48,index);
          LogicalType::~LogicalType(&local_48);
          local_e0._M_head_impl = (Expression *)this_02;
          ::std::
          vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                      *)&local_a8,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_e0);
          if ((BoundReferenceExpression *)local_e0._M_head_impl != (BoundReferenceExpression *)0x0)
          {
            (*(((Expression *)&(local_e0._M_head_impl)->super_BaseExpression)->super_BaseExpression)
              ._vptr_BaseExpression[1])();
          }
        }
        pLVar5 = ColumnDefinition::Type(this_01);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (local_88,pLVar5);
        local_c8._0_8_ = local_c8._0_8_ + 1;
      } while ((((_func_int **)local_c8._0_8_ != pp_Var7) || (local_c8._8_8_ != local_c8._16_8_)) ||
              (local_d8._0_8_ != local_c8._24_8_));
    }
    this_03 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>
                          *)((long)local_88[1].
                                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 0xf0));
    pLVar2 = local_88[1].
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pPVar6 = PhysicalPlan::
             Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                       (this_03,(vector<duckdb::LogicalType,_true> *)local_88,
                        (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)&local_a8,
                        (idx_t *)((long)local_88[1].
                                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x40));
    local_d8._0_8_ = pLVar2;
    __position._M_current =
         (pPVar6->children).
         super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pPVar6->children).
        super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                  *)&pPVar6->children,__position,
                 (reference_wrapper<duckdb::PhysicalOperator> *)local_d8);
    }
    else {
      (__position._M_current)->_M_data = (PhysicalOperator *)pLVar2;
      pprVar1 = &(pPVar6->children).
                 super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + 1;
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(&local_a8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(local_88);
    return pPVar6;
  }
  this_04 = (InternalException *)__cxa_allocate_exception(0x10);
  local_d8._0_8_ = local_c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"No defaults to push","");
  InternalException::InternalException(this_04,(string *)local_d8);
  __cxa_throw(this_04,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::ResolveDefaultsProjection(LogicalInsert &op, PhysicalOperator &child) {
	if (op.column_index_map.empty()) {
		throw InternalException("No defaults to push");
	}
	// columns specified by the user, push a projection
	vector<LogicalType> types;
	vector<unique_ptr<Expression>> select_list;
	for (auto &col : op.table.GetColumns().Physical()) {
		auto storage_idx = col.StorageOid();
		auto mapped_index = op.column_index_map[col.Physical()];
		if (mapped_index == DConstants::INVALID_INDEX) {
			// push default value
			select_list.push_back(std::move(op.bound_defaults[storage_idx]));
		} else {
			// push reference
			select_list.push_back(make_uniq<BoundReferenceExpression>(col.Type(), mapped_index));
		}
		types.push_back(col.Type());
	}
	auto &proj = Make<PhysicalProjection>(std::move(types), std::move(select_list), child.estimated_cardinality);
	proj.children.push_back(child);
	return proj;
}